

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void run_bitset_container_union
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar6 = src_1->n_runs;
  if (((uVar6 == 1) && (src_1->runs->value == 0)) && (src_1->runs->length == 0xffff)) {
    __assert_fail("!run_container_is_full(src_1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x34a3,
                  "void run_bitset_container_union(const run_container_t *, const bitset_container_t *, bitset_container_t *)"
                 );
  }
  if (src_2 != dst) {
    dst->cardinality = src_2->cardinality;
    memcpy(dst->words,src_2->words,0x2000);
    uVar6 = src_1->n_runs;
  }
  if (0 < (int)uVar6) {
    prVar3 = src_1->runs;
    puVar4 = dst->words;
    uVar8 = 0;
    do {
      uVar1 = prVar3[uVar8].value;
      uVar2 = prVar3[uVar8].length;
      uVar9 = (uint)uVar2 + (uint)uVar1;
      uVar10 = (uint)(uVar1 >> 6);
      uVar11 = uVar9 >> 6;
      if (uVar11 - uVar10 == 0) {
        puVar4[uVar10] =
             puVar4[uVar10] |
             (0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << ((byte)uVar1 & 0x3f);
      }
      else {
        uVar5 = puVar4[uVar11];
        puVar4[uVar10] = puVar4[uVar10] | -1L << ((byte)uVar1 & 0x3f);
        if (uVar10 + 1 < uVar11) {
          memset(puVar4 + (ulong)(uVar1 >> 6) + 1,0xff,
                 (ulong)((uVar11 - uVar10) - 2 >> 1) * 0x10 + 0x10);
        }
        puVar4[uVar11] = uVar5 | 0xffffffffffffffffU >> (~(byte)uVar9 & 0x3f);
      }
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  iVar7 = bitset_container_compute_cardinality(dst);
  dst->cardinality = iVar7;
  return;
}

Assistant:

void run_bitset_container_union(const run_container_t *src_1,
                                const bitset_container_t *src_2,
                                bitset_container_t *dst) {
    assert(!run_container_is_full(src_1));  // catch this case upstream
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_set_lenrange(dst->words, rle.value, rle.length);
    }
    dst->cardinality = bitset_container_compute_cardinality(dst);
}